

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Location loc_29;
  Location loc_30;
  Location loc_31;
  Location loc_32;
  Location loc_33;
  Location loc_34;
  Location loc_35;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  Token token_06;
  Token token_07;
  Token token_08;
  Token token_09;
  undefined8 uVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Enum EVar5;
  CallIndirectExpr *this_00;
  Expr *pEVar6;
  Expr *pEVar7;
  TableCopyExpr *this_01;
  undefined **ppuVar8;
  Var *this_02;
  undefined8 *puVar9;
  ExprType *this_03;
  int lane;
  long lVar10;
  byte bVar11;
  Location loc;
  Token token;
  Var table_index;
  v128 values;
  Location local_428;
  undefined1 local_408 [88];
  Var local_3b0;
  Type local_368;
  _func_int **local_348;
  Expr *pEStack_340;
  Type local_338;
  char *pcStack_330;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_328;
  undefined8 uStack_320;
  Type local_318;
  char *pcStack_310;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_308;
  undefined8 uStack_300;
  Type local_2f8;
  char *pcStack_2f0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_2e8;
  undefined8 uStack_2e0;
  Type local_2d8;
  char *pcStack_2d0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_2c8;
  undefined8 uStack_2c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2b0;
  Token local_298;
  Token local_258;
  Token local_218;
  Token local_1d8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  bVar11 = 0;
  GetToken((Token *)local_408,this);
  local_428.filename._M_str = (char *)CONCAT44(local_408._12_4_,local_408._8_4_);
  local_428.field_1._4_4_ = local_408._20_4_;
  local_428.field_1._0_4_ = local_408._16_4_;
  local_428.field_1._8_8_ = CONCAT44(local_408._28_4_,local_408._24_4_);
  local_428.filename._M_len = local_408._0_8_;
  TVar3 = Peek(this,0);
  switch(TVar3) {
  case AtomicFence:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    *(undefined8 *)&pEVar6->type_ = 5;
    ppuVar8 = &PTR__Expr_0019c818;
    goto LAB_0013e21e;
  case AtomicLoad:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_04.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_04.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_04.loc.field_1.field_0.first_column = local_408._20_4_;
    token_04.loc.field_1.field_0.line = local_408._16_4_;
    token_04.loc.field_1._12_4_ = local_408._28_4_;
    token_04.loc.field_1.field_0.last_column = local_408._24_4_;
    token_04.field_2.type_.type_index_ = local_408._44_4_;
    token_04.field_2.type_.enum_ = local_408._40_4_;
    token_04.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_04.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_15.filename._M_str = local_428.filename._M_str;
    loc_15.filename._M_len = local_428.filename._M_len;
    loc_15.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_15.field_1._8_8_ = local_428.field_1._8_8_;
    token_04.loc.filename._M_len = local_408._0_8_;
    token_04._32_8_ = local_408._32_8_;
    token_04.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_15,token_04,out_expr);
    break;
  case AtomicNotify:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_02.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_02.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_02.loc.field_1.field_0.first_column = local_408._20_4_;
    token_02.loc.field_1.field_0.line = local_408._16_4_;
    token_02.loc.field_1._12_4_ = local_408._28_4_;
    token_02.loc.field_1.field_0.last_column = local_408._24_4_;
    token_02.field_2.type_.type_index_ = local_408._44_4_;
    token_02.field_2.type_.enum_ = local_408._40_4_;
    token_02.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_02.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_10.filename._M_str = local_428.filename._M_str;
    loc_10.filename._M_len = local_428.filename._M_len;
    loc_10.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_10.field_1._8_8_ = local_428.field_1._8_8_;
    token_02.loc.filename._M_len = local_408._0_8_;
    token_02._32_8_ = local_408._32_8_;
    token_02.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_10,token_02,out_expr);
    break;
  case AtomicRmw:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_03.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_03.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_03.loc.field_1.field_0.first_column = local_408._20_4_;
    token_03.loc.field_1.field_0.line = local_408._16_4_;
    token_03.loc.field_1._12_4_ = local_408._28_4_;
    token_03.loc.field_1.field_0.last_column = local_408._24_4_;
    token_03.field_2.type_.type_index_ = local_408._44_4_;
    token_03.field_2.type_.enum_ = local_408._40_4_;
    token_03.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_03.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_14.filename._M_str = local_428.filename._M_str;
    loc_14.filename._M_len = local_428.filename._M_len;
    loc_14.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_14.field_1._8_8_ = local_428.field_1._8_8_;
    token_03.loc.filename._M_len = local_408._0_8_;
    token_03._32_8_ = local_408._32_8_;
    token_03.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_14,token_03,out_expr);
    break;
  case AtomicRmwCmpxchg:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_05.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_05.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_05.loc.field_1.field_0.first_column = local_408._20_4_;
    token_05.loc.field_1.field_0.line = local_408._16_4_;
    token_05.loc.field_1._12_4_ = local_408._28_4_;
    token_05.loc.field_1.field_0.last_column = local_408._24_4_;
    token_05.field_2.type_.type_index_ = local_408._44_4_;
    token_05.field_2.type_.enum_ = local_408._40_4_;
    token_05.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_05.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_19.filename._M_str = local_428.filename._M_str;
    loc_19.filename._M_len = local_428.filename._M_len;
    loc_19.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_19.field_1._8_8_ = local_428.field_1._8_8_;
    token_05.loc.filename._M_len = local_408._0_8_;
    token_05._32_8_ = local_408._32_8_;
    token_05.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_19,token_05,out_expr);
    break;
  case AtomicStore:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_06.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_06.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_06.loc.field_1.field_0.first_column = local_408._20_4_;
    token_06.loc.field_1.field_0.line = local_408._16_4_;
    token_06.loc.field_1._12_4_ = local_408._28_4_;
    token_06.loc.field_1.field_0.last_column = local_408._24_4_;
    token_06.field_2.type_.type_index_ = local_408._44_4_;
    token_06.field_2.type_.enum_ = local_408._40_4_;
    token_06.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_06.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_20.filename._M_str = local_428.filename._M_str;
    loc_20.filename._M_len = local_428.filename._M_len;
    loc_20.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_20.field_1._8_8_ = local_428.field_1._8_8_;
    token_06.loc.filename._M_len = local_408._0_8_;
    token_06._32_8_ = local_408._32_8_;
    token_06.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_20,token_06,out_expr);
    break;
  case AtomicWait:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    token_01.loc.filename._M_str._4_4_ = local_408._12_4_;
    token_01.loc.filename._M_str._0_4_ = local_408._8_4_;
    token_01.loc.field_1.field_0.first_column = local_408._20_4_;
    token_01.loc.field_1.field_0.line = local_408._16_4_;
    token_01.loc.field_1._12_4_ = local_408._28_4_;
    token_01.loc.field_1.field_0.last_column = local_408._24_4_;
    token_01.field_2.type_.type_index_ = local_408._44_4_;
    token_01.field_2.type_.enum_ = local_408._40_4_;
    token_01.field_2.literal_.text._M_len._4_4_ = local_408._52_4_;
    token_01.field_2.literal_.text._M_len._0_4_ = local_408._48_4_;
    loc_08.filename._M_str = local_428.filename._M_str;
    loc_08.filename._M_len = local_428.filename._M_len;
    loc_08.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_08.field_1._8_8_ = local_428.field_1._8_8_;
    token_01.loc.filename._M_len = local_408._0_8_;
    token_01._32_8_ = local_408._32_8_;
    token_01.field_2.literal_.text._M_str = (char *)local_408._56_8_;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)6>>
                      (this,loc_08,token_01,out_expr);
    break;
  case Binary:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x41 < local_408._32_4_ - 0x38) {
LAB_0013e756:
      __assert_fail("HasOpcode()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                    ,0x6d,"Opcode wabt::Token::opcode() const");
    }
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Binary;
    ppuVar8 = &PTR__Expr_0019d5a8;
    goto LAB_0013e033;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0x9bb,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume((Token *)local_408,this);
    loc_09.filename._M_str = local_428.filename._M_str;
    loc_09.filename._M_len = local_428.filename._M_len;
    loc_09.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_09.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_09,out_expr);
    break;
  case BrIf:
    Consume((Token *)local_408,this);
    loc_06.filename._M_str = local_428.filename._M_str;
    loc_06.filename._M_len = local_428.filename._M_len;
    loc_06.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_06.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)10>>(this,loc_06,out_expr);
    break;
  case BrTable:
    Consume((Token *)local_408,this);
    std::make_unique<wabt::BrTableExpr,wabt::Location&>((Location *)local_408);
    RVar4 = ParseVarList(this,(VarVector *)(local_408._0_8_ + 0x40));
    if (RVar4.enum_ != Error) {
      Var::operator=((Var *)(local_408._0_8_ + 0x58),
                     (Var *)&((intrusive_list_base<wabt::Expr> *)(local_408._0_8_ + 0x48))->next_
                             [-2].type_);
      this_03 = &((intrusive_list_base<wabt::Expr> *)(local_408._0_8_ + 0x48))->next_[-2].type_;
      ((intrusive_list_base<wabt::Expr> *)(local_408._0_8_ + 0x48))->next_ = (Expr *)this_03;
      Var::~Var((Var *)this_03);
      uVar1 = local_408._0_8_;
      local_408._0_4_ = Any;
      local_408._4_4_ = 0;
      pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar1;
      if (pEVar6 == (Expr *)0x0) goto LAB_0013e57b;
      (*pEVar6->_vptr_Expr[1])();
    }
    if ((Type)local_408._0_8_ != (Type)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_0013e57b;
  case Call:
    Consume((Token *)local_408,this);
    loc_03.filename._M_str = local_428.filename._M_str;
    loc_03.filename._M_len = local_428.filename._M_len;
    loc_03.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_03.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>(this,loc_03,out_expr);
    break;
  case CallIndirect:
    Consume((Token *)local_408,this);
    this_00 = (CallIndirectExpr *)operator_new(0x178);
    CallIndirectExpr::CallIndirectExpr(this_00,&local_428);
    this_02 = &local_78;
    goto LAB_0013d796;
  case CallRef:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x88);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = CallRef;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__CallRefExpr_0019c6d8;
    Var::Var((Var *)(pEVar6 + 1));
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
    goto LAB_0013e227;
  case Compare:
    this_00 = (CallIndirectExpr *)operator_new(0x40);
    Consume((Token *)local_408,this);
    if (0x41 < local_408._32_4_ - 0x38) goto LAB_0013e756;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.filename._M_len = local_428.filename._M_len;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.filename._M_str = local_428.filename._M_str;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->
             super_Expr).loc.field_1 + 8) = local_428.field_1._8_8_;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    type_ = Compare;
    (((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    _vptr_Expr = (_func_int **)&PTR__Expr_0019d5f8;
    *(undefined4 *)
     &(((ExprMixin<(wabt::ExprType)41> *)&this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr)
      .field_0x3c = local_408._40_4_;
    goto LAB_0013dbe8;
  case Const:
    local_408._16_4_ = 0;
    local_408._20_4_ = 0;
    local_408._24_4_ = 0;
    local_408._0_4_ = Any;
    local_408._4_4_ = 0;
    local_408._8_4_ = 0;
    local_408._12_4_ = 0;
    local_408._32_4_ = I32;
    local_408._36_4_ = 0xffffffff;
    local_408._48_4_ = 0;
    local_408._64_4_ = 0;
    RVar4 = ParseConst(this,(Const *)local_408,Normal);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    pEVar6 = (Expr *)operator_new(0x90);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Const;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_0019c728;
    puVar9 = (undefined8 *)local_408;
    pEVar7 = pEVar6 + 1;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pEVar7->_vptr_Expr = (_func_int **)*puVar9;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      pEVar7 = (Expr *)((long)pEVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    goto LAB_0013e221;
  case Convert:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x41 < local_408._32_4_ - 0x38) goto LAB_0013e756;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Convert;
    ppuVar8 = &PTR__Expr_0019d648;
    goto LAB_0013e033;
  case DataDrop:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_12.filename._M_str = local_428.filename._M_str;
    loc_12.filename._M_len = local_428.filename._M_len;
    loc_12.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_12.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)29>>(this,loc_12,out_expr);
    break;
  case Drop:
    Consume((Token *)local_408,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Drop;
    ppuVar8 = &PTR__Expr_0019d018;
    goto LAB_0013e21e;
  case ElemDrop:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_07.filename._M_str = local_428.filename._M_str;
    loc_07.filename._M_len = local_428.filename._M_len;
    loc_07.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_07.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>(this,loc_07,out_expr);
    break;
  case GlobalGet:
    Consume((Token *)local_408,this);
    loc_04.filename._M_str = local_428.filename._M_str;
    loc_04.filename._M_len = local_428.filename._M_len;
    loc_04.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_04.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)20>>(this,loc_04,out_expr);
    break;
  case GlobalSet:
    Consume((Token *)local_408,this);
    loc_13.filename._M_str = local_428.filename._M_str;
    loc_13.filename._M_len = local_428.filename._M_len;
    loc_13.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_13.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)21>>(this,loc_13,out_expr);
    break;
  case Load:
    local_2c8.offset = (size_t)local_428.field_1.field_1.offset;
    uStack_2c0 = local_428.field_1._8_8_;
    local_2d8.enum_ = (undefined4)local_428.filename._M_len;
    local_2d8.type_index_ = local_428.filename._M_len._4_4_;
    pcStack_2d0 = local_428.filename._M_str;
    Consume(&local_1d8,this);
    loc_27.filename._M_str = pcStack_2d0;
    loc_27.filename._M_len._0_4_ = local_2d8.enum_;
    loc_27.filename._M_len._4_4_ = local_2d8.type_index_;
    loc_27.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_2c8.offset;
    loc_27.field_1._8_8_ = uStack_2c0;
    token_07.loc.filename._M_str = local_1d8.loc.filename._M_str;
    token_07.loc.filename._M_len = local_1d8.loc.filename._M_len;
    token_07.loc.field_1.field_1.offset = local_1d8.loc.field_1.field_1.offset;
    token_07.loc.field_1._8_8_ = local_1d8.loc.field_1._8_8_;
    token_07.token_type_ = local_1d8.token_type_;
    token_07._36_4_ = local_1d8._36_4_;
    token_07.field_2.text_._M_len = local_1d8.field_2.text_._M_len;
    token_07.field_2.text_._M_str = local_1d8.field_2.text_._M_str;
    token_07.field_2.literal_.text._M_str = local_1d8.field_2.literal_.text._M_str;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)23>>
                      (this,loc_27,token_07,out_expr);
    break;
  case LocalGet:
    Consume((Token *)local_408,this);
    loc_01.filename._M_str = local_428.filename._M_str;
    loc_01.filename._M_len = local_428.filename._M_len;
    loc_01.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_01.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_01,out_expr);
    break;
  case LocalSet:
    Consume((Token *)local_408,this);
    loc_26.filename._M_str = local_428.filename._M_str;
    loc_26.filename._M_len = local_428.filename._M_len;
    loc_26.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_26.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)25>>(this,loc_26,out_expr);
    break;
  case LocalTee:
    Consume((Token *)local_408,this);
    loc_30.filename._M_str = local_428.filename._M_str;
    loc_30.filename._M_len = local_428.filename._M_len;
    loc_30.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_30.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)26>>(this,loc_30,out_expr);
    break;
  case MemoryCopy:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_16.filename._M_str = local_428.filename._M_str;
    loc_16.filename._M_len = local_428.filename._M_len;
    loc_16.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_16.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>(this,loc_16,out_expr);
    break;
  case MemoryFill:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_28.filename._M_str = local_428.filename._M_str;
    loc_28.filename._M_len = local_428.filename._M_len;
    loc_28.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_28.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)30>>(this,loc_28,out_expr);
    break;
  case MemoryGrow:
    Consume((Token *)local_408,this);
    loc_21.filename._M_str = local_428.filename._M_str;
    loc_21.filename._M_len = local_428.filename._M_len;
    loc_21.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_21.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)31>>(this,loc_21,out_expr);
    break;
  case MemoryInit:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_23.filename._M_str = local_428.filename._M_str;
    loc_23.filename._M_len = local_428.filename._M_len;
    loc_23.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_23.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseMemoryInstrVar<wabt::MemoryVarExpr<(wabt::ExprType)32>>(this,loc_23,out_expr);
    break;
  case MemorySize:
    Consume((Token *)local_408,this);
    loc_18.filename._M_str = local_428.filename._M_str;
    loc_18.filename._M_len = local_428.filename._M_len;
    loc_18.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_18.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)33>>(this,loc_18,out_expr);
    break;
  case Nop:
    Consume((Token *)local_408,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Nop;
    ppuVar8 = &PTR__Expr_0019cfe0;
    goto LAB_0013e21e;
  case RefFunc:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_24.filename._M_str = local_428.filename._M_str;
    loc_24.filename._M_len = local_428.filename._M_len;
    loc_24.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_24.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>(this,loc_24,out_expr);
    break;
  case RefIsNull:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = RefIsNull;
    ppuVar8 = &PTR__Expr_0019dae0;
    goto LAB_0013e21e;
  case RefNull:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    RVar4 = ParseRefKind(this,(Type *)local_408);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    pEVar6 = (Expr *)operator_new(0x48);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    pEVar6->type_ = RefNull;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_0019da90;
    *(undefined8 *)&pEVar6->field_0x3c = local_408._0_8_;
    goto LAB_0013e221;
  case Rethrow:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_02.filename._M_str = local_428.filename._M_str;
    loc_02.filename._M_len = local_428.filename._M_len;
    loc_02.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_02.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>(this,loc_02,out_expr);
    break;
  case ReturnCallIndirect:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    this_00 = (CallIndirectExpr *)operator_new(0x178);
    ReturnCallIndirectExpr::ReturnCallIndirectExpr((ReturnCallIndirectExpr *)this_00,&local_428);
    this_02 = &local_c0;
LAB_0013d796:
    Var::Var(this_02,0,&local_428);
    ParseVarOpt(this,&this_00->table,this_02);
    Var::~Var(this_02);
    RVar4 = ParseTypeUseOpt(this,&this_00->decl);
    if ((RVar4.enum_ == Error) ||
       (RVar4 = ParseUnboundFuncSignature(this,&(this_00->decl).sig), RVar4.enum_ == Error)) {
      (**(code **)((long)(((ExprMixin<(wabt::ExprType)41> *)
                          &this_00->super_ExprMixin<(wabt::ExprType)13>)->super_Expr)._vptr_Expr + 8
                  ))(this_00);
      return (Result)Error;
    }
LAB_0013dbe8:
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    goto LAB_0013e227;
  case ReturnCall:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_05.filename._M_str = local_428.filename._M_str;
    loc_05.filename._M_len = local_428.filename._M_len;
    loc_05.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_05.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>(this,loc_05,out_expr);
    break;
  case Return:
    Consume((Token *)local_408,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Return;
    ppuVar8 = &PTR__Expr_0019d140;
    goto LAB_0013e21e;
  case Select:
    Consume((Token *)local_408,this);
    local_408._0_4_ = Any;
    local_408._4_4_ = 0;
    local_408._8_4_ = 0;
    local_408._12_4_ = 0;
    local_408._16_4_ = 0;
    local_408._20_4_ = 0;
    if ((((this->options_->features).reference_types_enabled_ == true) &&
        (bVar2 = PeekMatchLpar(this,Result), bVar2)) &&
       (RVar4 = ParseUnboundValueTypeList
                          (this,Result,(TypeVector *)local_408,
                           (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)0x0), RVar4.enum_ == Error)) {
      if ((Type)local_408._0_8_ == (Type)0x0) {
        return (Result)Error;
      }
      operator_delete((void *)local_408._0_8_,
                      CONCAT44(local_408._20_4_,local_408._16_4_) - local_408._0_8_);
      return (Result)Error;
    }
    pEVar7 = (Expr *)operator_new(0x58);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_2b0,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_408);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = local_428.filename._M_len;
    (pEVar7->loc).filename._M_str = local_428.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar7->type_ = Select;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__SelectExpr_0019c630;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar7 + 1),&local_2b0);
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar7;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    if (local_2b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((Type)local_408._0_8_ != (Type)0x0) {
      operator_delete((void *)local_408._0_8_,
                      CONCAT44(local_408._20_4_,local_408._16_4_) - local_408._0_8_);
    }
    goto LAB_0013e57b;
  case SimdLaneOp:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    local_3b0.loc.filename._M_len = 0;
    loc_31.filename._M_str = local_428.filename._M_str;
    loc_31.filename._M_len = local_428.filename._M_len;
    loc_31.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_31.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParseSimdLane(this,loc_31,(uint64_t *)&local_3b0);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    pEVar6 = (Expr *)operator_new(0x48);
    if (0x41 < local_408._32_4_ - 0x38) goto LAB_0013e756;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = SimdLaneOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_0019c868;
    *(undefined4 *)&pEVar6->field_0x3c = local_408._40_4_;
    pEVar6[1]._vptr_Expr = (_func_int **)local_3b0.loc.filename._M_len;
    goto LAB_0013e221;
  case SimdLoadLane:
    local_308.offset = (size_t)local_428.field_1.field_1.offset;
    uStack_300 = local_428.field_1._8_8_;
    local_318.enum_ = (undefined4)local_428.filename._M_len;
    local_318.type_index_ = local_428.filename._M_len._4_4_;
    pcStack_310 = local_428.filename._M_str;
    Consume(&local_258,this);
    loc_34.filename._M_str = pcStack_310;
    loc_34.filename._M_len._0_4_ = local_318.enum_;
    loc_34.filename._M_len._4_4_ = local_318.type_index_;
    loc_34.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_308.offset;
    loc_34.field_1._8_8_ = uStack_300;
    token_09.loc.filename._M_str = local_258.loc.filename._M_str;
    token_09.loc.filename._M_len = local_258.loc.filename._M_len;
    token_09.loc.field_1.field_1.offset = local_258.loc.field_1.field_1.offset;
    token_09.loc.field_1._8_8_ = local_258.loc.field_1._8_8_;
    token_09.token_type_ = local_258.token_type_;
    token_09._36_4_ = local_258._36_4_;
    token_09.field_2.text_._M_len = local_258.field_2.text_._M_len;
    token_09.field_2.text_._M_str = local_258.field_2.text_._M_str;
    token_09.field_2.literal_.text._M_str = local_258.field_2.literal_.text._M_str;
    RVar4 = ParseSIMDLoadStoreInstr<wabt::SimdLoadLaneExpr>(this,loc_34,token_09,out_expr);
    break;
  case SimdStoreLane:
    local_328.offset = (size_t)local_428.field_1.field_1.offset;
    uStack_320 = local_428.field_1._8_8_;
    local_338.enum_ = (undefined4)local_428.filename._M_len;
    local_338.type_index_ = local_428.filename._M_len._4_4_;
    pcStack_330 = local_428.filename._M_str;
    Consume(&local_298,this);
    loc_00.filename._M_str = pcStack_330;
    loc_00.filename._M_len._0_4_ = local_338.enum_;
    loc_00.filename._M_len._4_4_ = local_338.type_index_;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_328.offset;
    loc_00.field_1._8_8_ = uStack_320;
    token_00.loc.filename._M_str = local_298.loc.filename._M_str;
    token_00.loc.filename._M_len = local_298.loc.filename._M_len;
    token_00.loc.field_1.field_1.offset = local_298.loc.field_1.field_1.offset;
    token_00.loc.field_1._8_8_ = local_298.loc.field_1._8_8_;
    token_00.token_type_ = local_298.token_type_;
    token_00._36_4_ = local_298._36_4_;
    token_00.field_2.text_._M_len = local_298.field_2.text_._M_len;
    token_00.field_2.text_._M_str = local_298.field_2.text_._M_str;
    token_00.field_2.literal_.text._M_str = local_298.field_2.literal_.text._M_str;
    RVar4 = ParseSIMDLoadStoreInstr<wabt::SimdStoreLaneExpr>(this,loc_00,token_00,out_expr);
    break;
  case SimdShuffleOp:
    Consume((Token *)&local_3b0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&local_3b0);
    lVar10 = 0;
    do {
      GetToken((Token *)local_408,this);
      loc_17.filename._M_str._4_4_ = local_408._12_4_;
      loc_17.filename._M_str._0_4_ = local_408._8_4_;
      loc_17.field_1.field_0.first_column = local_408._20_4_;
      loc_17.field_1.field_0.line = local_408._16_4_;
      loc_17.field_1._12_4_ = local_408._28_4_;
      loc_17.field_1.field_0.last_column = local_408._24_4_;
      local_368.enum_ = local_408._0_4_;
      local_368.type_index_ = local_408._4_4_;
      loc_17.filename._M_len = local_408._0_8_;
      RVar4 = ParseSimdLane(this,loc_17,(uint64_t *)local_408);
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
      *(undefined1 *)((long)&local_348 + lVar10) = local_408[0];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    pEVar6 = (Expr *)operator_new(0x50);
    if (0x41 < local_3b0.type_ - 0x38) goto LAB_0013e756;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = SimdShuffleOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_0019c8b8;
    *(Index *)&pEVar6->field_0x3c = local_3b0.field_2.index_;
    pEVar6[1]._vptr_Expr = local_348;
    pEVar6[1].super_intrusive_list_base<wabt::Expr>.next_ = pEStack_340;
    goto LAB_0013e221;
  case Store:
    local_2e8.offset = (size_t)local_428.field_1.field_1.offset;
    uStack_2e0 = local_428.field_1._8_8_;
    local_2f8.enum_ = (undefined4)local_428.filename._M_len;
    local_2f8.type_index_ = local_428.filename._M_len._4_4_;
    pcStack_2f0 = local_428.filename._M_str;
    Consume(&local_218,this);
    loc_32.filename._M_str = pcStack_2f0;
    loc_32.filename._M_len._0_4_ = local_2f8.enum_;
    loc_32.filename._M_len._4_4_ = local_2f8.type_index_;
    loc_32.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_2e8.offset;
    loc_32.field_1._8_8_ = uStack_2e0;
    token_08.loc.filename._M_str = local_218.loc.filename._M_str;
    token_08.loc.filename._M_len = local_218.loc.filename._M_len;
    token_08.loc.field_1.field_1.offset = local_218.loc.field_1.field_1.offset;
    token_08.loc.field_1._8_8_ = local_218.loc.field_1._8_8_;
    token_08.token_type_ = local_218.token_type_;
    token_08._36_4_ = local_218._36_4_;
    token_08.field_2.text_._M_len = local_218.field_2.text_._M_len;
    token_08.field_2.text_._M_str = local_218.field_2.text_._M_str;
    token_08.field_2.literal_.text._M_str = local_218.field_2.literal_.text._M_str;
    RVar4 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)49>>
                      (this,loc_32,token_08,out_expr);
    break;
  case TableCopy:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    Var::Var((Var *)local_408,0,&local_428);
    Var::Var(&local_3b0,0,&local_428);
    if ((this->options_->features).reference_types_enabled_ == true) {
      Var::Var(&local_108,(Var *)local_408);
      ParseVarOpt(this,(Var *)local_408,&local_108);
      Var::~Var(&local_108);
      Var::Var(&local_150,&local_3b0);
      ParseVarOpt(this,&local_3b0,&local_150);
      Var::~Var(&local_150);
    }
    this_01 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr(this_01,(Var *)local_408,&local_3b0,&local_428);
    goto LAB_0013e6c8;
  case TableFill:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_11.filename._M_str = local_428.filename._M_str;
    loc_11.filename._M_len = local_428.filename._M_len;
    loc_11.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_11.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)57>>(this,loc_11,out_expr);
    break;
  case TableGet:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_29.filename._M_str = local_428.filename._M_str;
    loc_29.filename._M_len = local_428.filename._M_len;
    loc_29.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_29.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)53>>(this,loc_29,out_expr);
    break;
  case TableGrow:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_35.filename._M_str = local_428.filename._M_str;
    loc_35.filename._M_len = local_428.filename._M_len;
    loc_35.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_35.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>(this,loc_35,out_expr);
    break;
  case TableInit:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    Var::Var((Var *)local_408,0,&local_428);
    RVar4 = ParseVar(this,(Var *)local_408);
    if (RVar4.enum_ == Error) {
      Var::~Var((Var *)local_408);
      return (Result)Error;
    }
    Var::Var(&local_3b0,0,&local_428);
    Var::Var(&local_198,&local_3b0);
    bVar2 = ParseVarOpt(this,&local_3b0,&local_198);
    Var::~Var(&local_198);
    if (bVar2) {
      std::swap<wabt::Var>((Var *)local_408,&local_3b0);
    }
    this_01 = (TableCopyExpr *)operator_new(0xd0);
    TableInitExpr::TableInitExpr((TableInitExpr *)this_01,(Var *)local_408,&local_3b0,&local_428);
LAB_0013e6c8:
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_01;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    Var::~Var(&local_3b0);
    Var::~Var((Var *)local_408);
    goto LAB_0013e57b;
  case TableSet:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_25.filename._M_str = local_428.filename._M_str;
    loc_25.filename._M_len = local_428.filename._M_len;
    loc_25.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_25.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)56>>(this,loc_25,out_expr);
    break;
  case TableSize:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_22.filename._M_str = local_428.filename._M_str;
    loc_22.filename._M_len = local_428.filename._M_len;
    loc_22.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_22.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)55>>(this,loc_22,out_expr);
    break;
  case Ternary:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x41 < local_408._32_4_ - 0x38) goto LAB_0013e756;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Ternary;
    ppuVar8 = &PTR__Expr_0019dee8;
    goto LAB_0013e033;
  case Throw:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    loc_33.filename._M_str = local_428.filename._M_str;
    loc_33.filename._M_len = local_428.filename._M_len;
    loc_33.field_1.field_1.offset = local_428.field_1.field_1.offset;
    loc_33.field_1._8_8_ = local_428.field_1._8_8_;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)59>>(this,loc_33,out_expr);
    break;
  case Unary:
    Consume((Token *)local_408,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_408);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x41 < local_408._32_4_ - 0x38) goto LAB_0013e756;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
     &(pEVar6->loc).field_1 = local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Unary;
    ppuVar8 = &PTR__Expr_0019d558;
LAB_0013e033:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
    *(undefined4 *)&pEVar6->field_0x3c = local_408._40_4_;
    goto LAB_0013e221;
  case Last_Opcode:
    Consume((Token *)local_408,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename._M_len = local_428.filename._M_len;
    (pEVar6->loc).filename._M_str = local_428.filename._M_str;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_428.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_428.field_1._8_8_;
    pEVar6->type_ = Last;
    ppuVar8 = &PTR__Expr_0019cfa8;
LAB_0013e21e:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
LAB_0013e221:
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
LAB_0013e227:
    if (pEVar7 != (Expr *)0x0) {
      (*pEVar7->_vptr_Expr[1])();
    }
    goto LAB_0013e57b;
  }
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
LAB_0013e57b:
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          PeekMatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseResultList(&result, nullptr));
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = std::make_unique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = std::make_unique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::CallRef: {
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new CallRefExpr(loc));
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<ReturnCallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(ParseLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(ParseLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryBinaryExpr<MemoryCopyExpr>(loc, out_expr));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryExpr<MemoryFillExpr>(loc, out_expr));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemorySizeExpr>(loc, out_expr));
      break;

    case TokenType::MemoryGrow:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemoryGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull: {
      ErrorUnlessOpcodeEnabled(Consume());
      Type type;
      CHECK_RESULT(ParseRefKind(&type));
      out_expr->reset(new RefNullExpr(type, loc));
      break;
    }

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RethrowExpr>(loc, out_expr));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicFence: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint32_t consistency_model = 0x0;
      out_expr->reset(new AtomicFenceExpr(consistency_model, loc));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParseLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);

      uint64_t lane_idx = 0;
      Result result = ParseSimdLane(loc, &lane_idx);

      if (Failed(result)) {
        return Result::Error;
      }

      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdLoadLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdLoadLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdStoreLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdStoreLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      v128 values;
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();
        uint64_t lane_idx;
        Result result = ParseSimdLane(loc, &lane_idx);
        if (Failed(result)) {
          return Result::Error;
        }

        values.set_u8(lane, static_cast<uint8_t>(lane_idx));
      }

      out_expr->reset(new SimdShuffleOpExpr(token.opcode(), values, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}